

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMinkowskiPenetrationDepthSolver.cpp
# Opt level: O3

bool __thiscall
btMinkowskiPenetrationDepthSolver::calcPenDepth
          (btMinkowskiPenetrationDepthSolver *this,btVoronoiSimplexSolver *simplexSolver,
          btConvexShape *convexA,btConvexShape *convexB,btTransform *transA,btTransform *transB,
          btVector3 *v,btVector3 *pa,btVector3 *pb,btIDebugDraw *debugDraw)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  int i;
  int iVar19;
  uint uVar20;
  long lVar21;
  bool bVar22;
  btScalar bVar23;
  btScalar bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  btIntermediateResult res;
  btVector3 supportVerticesABatch [62];
  btVector3 seperatingAxisInBBatch [62];
  btVector3 seperatingAxisInABatch [62];
  btVector3 supportVerticesBBatch [62];
  btScalar local_115c;
  float local_1148;
  float local_1138;
  float fStack_1134;
  Result local_10e8 [3];
  undefined8 local_10d0;
  float fStack_10c8;
  undefined4 uStack_10c4;
  float local_10c0;
  char local_10bc;
  undefined8 local_10b8;
  ulong auStack_10b0 [124];
  btGjkPairDetector local_cd0;
  ClosestPointInput local_c68;
  undefined1 auStack_be0 [8];
  undefined1 local_bd8 [672];
  undefined1 auStack_938 [312];
  undefined1 auStack_800 [8];
  undefined1 local_7f8 [672];
  undefined1 auStack_558 [320];
  float local_418 [250];
  
  if ((convexA->super_btCollisionShape).m_shapeType - 0x11U < 2) {
    bVar22 = (convexB->super_btCollisionShape).m_shapeType - 0x11U < 2;
  }
  else {
    bVar22 = false;
  }
  lVar21 = 8;
  do {
    getPenetrationDirections();
    fVar25 = *(float *)(lVar21 + 0x2288d8);
    fVar26 = *(float *)(lVar21 + 0x2288dc);
    fVar29 = *(float *)((long)getPenetrationDirections::sPenetrationDirections[0].m_floats + lVar21)
    ;
    fVar30 = (float)((uint)fVar25 ^ (uint)DAT_001ee270);
    uVar6 = *(undefined8 *)(transA->m_basis).m_el[0].m_floats;
    uVar7 = *(undefined8 *)(transA->m_basis).m_el[1].m_floats;
    uVar8 = *(undefined8 *)(transA->m_basis).m_el[2].m_floats;
    auVar13._4_4_ =
         (fVar30 * (float)((ulong)uVar6 >> 0x20) - (float)((ulong)uVar7 >> 0x20) * fVar26) -
         (float)((ulong)uVar8 >> 0x20) * fVar29;
    auVar13._0_4_ = (fVar30 * (float)uVar6 - (float)uVar7 * fVar26) - (float)uVar8 * fVar29;
    auVar13._8_4_ =
         ((transA->m_basis).m_el[0].m_floats[2] * fVar30 -
         (transA->m_basis).m_el[1].m_floats[2] * fVar26) -
         (transA->m_basis).m_el[2].m_floats[2] * fVar29;
    auVar13._12_4_ = 0;
    *(undefined1 (*) [16])(auStack_800 + lVar21) = auVar13;
    uVar6 = *(undefined8 *)(transB->m_basis).m_el[0].m_floats;
    uVar7 = *(undefined8 *)(transB->m_basis).m_el[1].m_floats;
    uVar8 = *(undefined8 *)(transB->m_basis).m_el[2].m_floats;
    auVar10._4_4_ =
         (float)((ulong)uVar8 >> 0x20) * fVar29 +
         fVar25 * (float)((ulong)uVar6 >> 0x20) + (float)((ulong)uVar7 >> 0x20) * fVar26;
    auVar10._0_4_ = (float)uVar8 * fVar29 + fVar25 * (float)uVar6 + (float)uVar7 * fVar26;
    auVar10._8_4_ =
         fVar29 * (transB->m_basis).m_el[2].m_floats[2] +
         fVar25 * (transB->m_basis).m_el[0].m_floats[2] +
         fVar26 * (transB->m_basis).m_el[1].m_floats[2];
    auVar10._12_4_ = 0;
    *(undefined1 (*) [16])(auStack_be0 + lVar21) = auVar10;
    lVar21 = lVar21 + 0x10;
  } while (lVar21 != 0x2a8);
  uVar16 = (*(convexA->super_btCollisionShape)._vptr_btCollisionShape[0x15])(convexA);
  if ((int)uVar16 < 1) {
    uVar16 = 0x2a;
  }
  else {
    lVar21 = 0;
    uVar18 = 0;
    do {
      iVar19 = (int)uVar18;
      (*(convexA->super_btCollisionShape)._vptr_btCollisionShape[0x16])(convexA,uVar18,&local_10b8);
      fVar26 = (float)auStack_10b0[0] * (transA->m_basis).m_el[0].m_floats[2];
      fVar29 = (float)auStack_10b0[0] * (transA->m_basis).m_el[1].m_floats[2];
      auStack_10b0[0] =
           (ulong)(uint)((float)auStack_10b0[0] * (transA->m_basis).m_el[2].m_floats[2] +
                        (float)local_10b8 * (transA->m_basis).m_el[2].m_floats[0] +
                        local_10b8._4_4_ * (transA->m_basis).m_el[2].m_floats[1]);
      local_10b8 = CONCAT44(fVar29 + (float)local_10b8 * (transA->m_basis).m_el[1].m_floats[0] +
                                     (transA->m_basis).m_el[1].m_floats[1] * local_10b8._4_4_,
                            fVar26 + (float)local_10b8 * (transA->m_basis).m_el[0].m_floats[0] +
                                     (transA->m_basis).m_el[0].m_floats[1] * local_10b8._4_4_);
      getPenetrationDirections();
      *(undefined8 *)
       ((long)getPenetrationDirections::sPenetrationDirections[0x2a].m_floats + lVar21) = local_10b8
      ;
      *(ulong *)((long)getPenetrationDirections::sPenetrationDirections[0x2a].m_floats + lVar21 + 8)
           = auStack_10b0[0];
      fVar26 = (float)((uint)(float)local_10b8 ^ (uint)DAT_001ee270);
      uVar6 = *(undefined8 *)(transA->m_basis).m_el[0].m_floats;
      uVar7 = *(undefined8 *)(transA->m_basis).m_el[1].m_floats;
      uVar8 = *(undefined8 *)(transA->m_basis).m_el[2].m_floats;
      auVar14._4_4_ =
           (fVar26 * (float)((ulong)uVar6 >> 0x20) -
           (float)((ulong)uVar7 >> 0x20) * local_10b8._4_4_) -
           (float)((ulong)uVar8 >> 0x20) * (float)auStack_10b0[0];
      auVar14._0_4_ =
           (fVar26 * (float)uVar6 - (float)uVar7 * local_10b8._4_4_) -
           (float)uVar8 * (float)auStack_10b0[0];
      auVar14._8_4_ =
           ((transA->m_basis).m_el[0].m_floats[2] * fVar26 -
           (transA->m_basis).m_el[1].m_floats[2] * local_10b8._4_4_) -
           (transA->m_basis).m_el[2].m_floats[2] * (float)auStack_10b0[0];
      auVar14._12_4_ = 0;
      *(undefined1 (*) [16])(auStack_558 + lVar21) = auVar14;
      uVar6 = *(undefined8 *)(transB->m_basis).m_el[0].m_floats;
      uVar7 = *(undefined8 *)(transB->m_basis).m_el[1].m_floats;
      uVar8 = *(undefined8 *)(transB->m_basis).m_el[2].m_floats;
      auVar11._4_4_ =
           (float)((ulong)uVar8 >> 0x20) * (float)auStack_10b0[0] +
           (float)local_10b8 * (float)((ulong)uVar6 >> 0x20) +
           (float)((ulong)uVar7 >> 0x20) * local_10b8._4_4_;
      auVar11._0_4_ =
           (float)uVar8 * (float)auStack_10b0[0] +
           (float)local_10b8 * (float)uVar6 + (float)uVar7 * local_10b8._4_4_;
      auVar11._8_4_ =
           (float)auStack_10b0[0] * (transB->m_basis).m_el[2].m_floats[2] +
           (float)local_10b8 * (transB->m_basis).m_el[0].m_floats[2] +
           local_10b8._4_4_ * (transB->m_basis).m_el[1].m_floats[2];
      auVar11._12_4_ = 0;
      *(undefined1 (*) [16])(auStack_938 + lVar21) = auVar11;
      uVar20 = iVar19 + 1;
      uVar18 = (ulong)uVar20;
      lVar21 = lVar21 + 0x10;
    } while (uVar16 != uVar20);
    uVar16 = iVar19 + 0x2b;
  }
  uVar20 = (*(convexB->super_btCollisionShape)._vptr_btCollisionShape[0x15])(convexB);
  if (0 < (int)uVar20) {
    lVar21 = (ulong)uVar16 << 4;
    uVar18 = 0;
    do {
      (*(convexB->super_btCollisionShape)._vptr_btCollisionShape[0x16])(convexB,uVar18,&local_10b8);
      fVar26 = (float)auStack_10b0[0] * (transB->m_basis).m_el[0].m_floats[2];
      fVar29 = (float)auStack_10b0[0] * (transB->m_basis).m_el[1].m_floats[2];
      auStack_10b0[0] =
           (ulong)(uint)((float)auStack_10b0[0] * (transB->m_basis).m_el[2].m_floats[2] +
                        (float)local_10b8 * (transB->m_basis).m_el[2].m_floats[0] +
                        local_10b8._4_4_ * (transB->m_basis).m_el[2].m_floats[1]);
      local_10b8 = CONCAT44(fVar29 + (float)local_10b8 * (transB->m_basis).m_el[1].m_floats[0] +
                                     (transB->m_basis).m_el[1].m_floats[1] * local_10b8._4_4_,
                            fVar26 + (float)local_10b8 * (transB->m_basis).m_el[0].m_floats[0] +
                                     (transB->m_basis).m_el[0].m_floats[1] * local_10b8._4_4_);
      getPenetrationDirections();
      *(undefined8 *)((long)getPenetrationDirections::sPenetrationDirections[0].m_floats + lVar21) =
           local_10b8;
      *(ulong *)((long)getPenetrationDirections::sPenetrationDirections[0].m_floats + lVar21 + 8) =
           auStack_10b0[0];
      fVar26 = (float)((uint)(float)local_10b8 ^ (uint)DAT_001ee270);
      uVar6 = *(undefined8 *)(transA->m_basis).m_el[0].m_floats;
      uVar7 = *(undefined8 *)(transA->m_basis).m_el[1].m_floats;
      uVar8 = *(undefined8 *)(transA->m_basis).m_el[2].m_floats;
      auVar15._4_4_ =
           (fVar26 * (float)((ulong)uVar6 >> 0x20) -
           (float)((ulong)uVar7 >> 0x20) * local_10b8._4_4_) -
           (float)((ulong)uVar8 >> 0x20) * (float)auStack_10b0[0];
      auVar15._0_4_ =
           (fVar26 * (float)uVar6 - (float)uVar7 * local_10b8._4_4_) -
           (float)uVar8 * (float)auStack_10b0[0];
      auVar15._8_4_ =
           ((transA->m_basis).m_el[0].m_floats[2] * fVar26 -
           (transA->m_basis).m_el[1].m_floats[2] * local_10b8._4_4_) -
           (transA->m_basis).m_el[2].m_floats[2] * (float)auStack_10b0[0];
      auVar15._12_4_ = 0;
      *(undefined1 (*) [16])(local_7f8 + lVar21) = auVar15;
      uVar6 = *(undefined8 *)(transB->m_basis).m_el[0].m_floats;
      uVar7 = *(undefined8 *)(transB->m_basis).m_el[1].m_floats;
      uVar8 = *(undefined8 *)(transB->m_basis).m_el[2].m_floats;
      auVar12._4_4_ =
           (float)((ulong)uVar8 >> 0x20) * (float)auStack_10b0[0] +
           (float)local_10b8 * (float)((ulong)uVar6 >> 0x20) +
           (float)((ulong)uVar7 >> 0x20) * local_10b8._4_4_;
      auVar12._0_4_ =
           (float)uVar8 * (float)auStack_10b0[0] +
           (float)local_10b8 * (float)uVar6 + (float)uVar7 * local_10b8._4_4_;
      auVar12._8_4_ =
           (float)auStack_10b0[0] * (transB->m_basis).m_el[2].m_floats[2] +
           (float)local_10b8 * (transB->m_basis).m_el[0].m_floats[2] +
           local_10b8._4_4_ * (transB->m_basis).m_el[1].m_floats[2];
      auVar12._12_4_ = 0;
      *(undefined1 (*) [16])(local_bd8 + lVar21) = auVar12;
      uVar17 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar17;
      lVar21 = lVar21 + 0x10;
    } while (uVar20 != uVar17);
    uVar16 = uVar16 + uVar17;
  }
  (*(convexA->super_btCollisionShape)._vptr_btCollisionShape[0x13])
            (convexA,local_7f8,&local_10b8,(ulong)uVar16);
  (*(convexB->super_btCollisionShape)._vptr_btCollisionShape[0x13])
            (convexB,local_bd8,local_418,(ulong)uVar16);
  if ((int)uVar16 < 1) {
    local_1138 = 0.0;
    fStack_1134 = 0.0;
    fVar26 = 1e+18;
    local_1148 = 0.0;
    local_115c = 0.0;
  }
  else {
    local_1138 = 0.0;
    fStack_1134 = 0.0;
    local_115c = 0.0;
    fVar26 = 1e+18;
    lVar21 = 0;
    local_1148 = 0.0;
    do {
      getPenetrationDirections();
      fVar29 = 0.0;
      if (!bVar22) {
        fVar29 = *(float *)((long)getPenetrationDirections::sPenetrationDirections[0].m_floats +
                           lVar21 + 8);
      }
      uVar6 = *(undefined8 *)
               ((long)getPenetrationDirections::sPenetrationDirections[0].m_floats + lVar21);
      fVar25 = (float)uVar6;
      fVar30 = (float)((ulong)uVar6 >> 0x20);
      if (0.01 < fVar29 * fVar29 + fVar25 * fVar25 + fVar30 * fVar30) {
        fVar28 = *(float *)((long)auStack_10b0 + lVar21 + -8);
        fVar1 = *(float *)((long)auStack_10b0 + lVar21 + -4);
        fVar2 = *(float *)((long)auStack_10b0 + lVar21);
        fVar3 = *(float *)((long)local_418 + lVar21);
        fVar4 = *(float *)((long)local_418 + lVar21 + 4);
        fVar5 = *(float *)((long)local_418 + lVar21 + 8);
        fVar27 = 0.0;
        if (!bVar22) {
          fVar27 = ((transB->m_origin).m_floats[2] +
                   (transB->m_basis).m_el[2].m_floats[2] * fVar5 +
                   (transB->m_basis).m_el[2].m_floats[0] * fVar3 +
                   (transB->m_basis).m_el[2].m_floats[1] * fVar4) -
                   ((transA->m_origin).m_floats[2] +
                   (transA->m_basis).m_el[2].m_floats[2] * fVar2 +
                   (transA->m_basis).m_el[2].m_floats[0] * fVar28 +
                   (transA->m_basis).m_el[2].m_floats[1] * fVar1);
        }
        fVar28 = fVar27 * fVar29 +
                 (((transB->m_origin).m_floats[0] +
                  (transB->m_basis).m_el[0].m_floats[2] * fVar5 +
                  (transB->m_basis).m_el[0].m_floats[0] * fVar3 +
                  (transB->m_basis).m_el[0].m_floats[1] * fVar4) -
                 ((transA->m_origin).m_floats[0] +
                 (transA->m_basis).m_el[0].m_floats[2] * fVar2 +
                 (transA->m_basis).m_el[0].m_floats[0] * fVar28 +
                 (transA->m_basis).m_el[0].m_floats[1] * fVar1)) * fVar25 +
                 (((transB->m_origin).m_floats[1] +
                  (transB->m_basis).m_el[1].m_floats[2] * fVar5 +
                  (transB->m_basis).m_el[1].m_floats[0] * fVar3 +
                  (transB->m_basis).m_el[1].m_floats[1] * fVar4) -
                 ((transA->m_origin).m_floats[1] +
                 (transA->m_basis).m_el[1].m_floats[2] * fVar2 +
                 (transA->m_basis).m_el[1].m_floats[0] * fVar28 +
                 (transA->m_basis).m_el[1].m_floats[1] * fVar1)) * fVar30;
        if (fVar28 < fVar26) {
          local_115c = *(btScalar *)
                        ((long)getPenetrationDirections::sPenetrationDirections[0].m_floats +
                        lVar21 + 0xc);
          local_1138 = fVar25;
          fStack_1134 = fVar30;
          local_1148 = fVar29;
          fVar26 = fVar28;
        }
      }
      lVar21 = lVar21 + 0x10;
    } while ((ulong)uVar16 << 4 != lVar21);
  }
  btConvexShape::getMarginNonVirtual(convexA);
  btConvexShape::getMarginNonVirtual(convexB);
  if (0.0 <= fVar26) {
    bVar23 = btConvexShape::getMarginNonVirtual(convexA);
    bVar24 = btConvexShape::getMarginNonVirtual(convexB);
    fVar26 = fVar26 + bVar24 + bVar23 + 0.5;
    btGjkPairDetector::btGjkPairDetector
              (&local_cd0,convexA,convexB,simplexSolver,(btConvexPenetrationDepthSolver *)0x0);
    uVar6 = *(undefined8 *)(transA->m_origin).m_floats;
    local_c68.m_transformA.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(transA->m_basis).m_el[0].m_floats;
    local_c68.m_transformA.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((transA->m_basis).m_el[0].m_floats + 2);
    local_c68.m_transformA.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(transA->m_basis).m_el[1].m_floats;
    local_c68.m_transformA.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((transA->m_basis).m_el[1].m_floats + 2);
    local_c68.m_transformA.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(transA->m_basis).m_el[2].m_floats;
    local_c68.m_transformA.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((transA->m_basis).m_el[2].m_floats + 2);
    local_c68.m_transformA.m_origin.m_floats[1] =
         (float)((ulong)uVar6 >> 0x20) + fVar26 * fStack_1134;
    local_c68.m_transformA.m_origin.m_floats[0] = (float)uVar6 + fVar26 * local_1138;
    local_c68.m_transformA.m_origin.m_floats[2] =
         local_1148 * fVar26 + (transA->m_origin).m_floats[2];
    local_c68.m_transformA.m_origin.m_floats[3] = 0.0;
    local_c68.m_transformB.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(transB->m_basis).m_el[0].m_floats;
    local_c68.m_transformB.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((transB->m_basis).m_el[0].m_floats + 2);
    local_c68.m_transformB.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(transB->m_basis).m_el[1].m_floats;
    local_c68.m_transformB.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((transB->m_basis).m_el[1].m_floats + 2);
    local_c68.m_transformB.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(transB->m_basis).m_el[2].m_floats;
    local_c68.m_transformB.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((transB->m_basis).m_el[2].m_floats + 2);
    local_c68.m_transformB.m_origin.m_floats._0_8_ = *(undefined8 *)(transB->m_origin).m_floats;
    local_c68.m_transformB.m_origin.m_floats._8_8_ =
         *(undefined8 *)((transB->m_origin).m_floats + 2);
    local_c68.m_maximumDistanceSquared = 1e+18;
    local_10e8[0]._vptr_Result = (_func_int **)&PTR__Result_0021fcd8;
    local_10bc = '\0';
    local_cd0.m_cachedSeparatingAxis.m_floats._0_8_ =
         CONCAT44(fStack_1134,local_1138) ^ 0x8000000080000000;
    local_cd0.m_cachedSeparatingAxis.m_floats[2] = -local_1148;
    local_cd0.m_cachedSeparatingAxis.m_floats[3] = 0.0;
    btGjkPairDetector::getClosestPoints(&local_cd0,&local_c68,local_10e8,debugDraw,false);
    if (local_10bc == '\x01') {
      fVar26 = fVar26 - local_10c0;
      auVar9._4_4_ = (float)((ulong)local_10d0 >> 0x20) - fVar26 * fStack_1134;
      auVar9._0_4_ = (float)local_10d0 - fVar26 * local_1138;
      auVar9._8_4_ = fStack_10c8 - local_1148 * fVar26;
      auVar9._12_4_ = 0;
      *(undefined1 (*) [16])pa->m_floats = auVar9;
      *(undefined8 *)pb->m_floats = local_10d0;
      *(ulong *)(pb->m_floats + 2) = CONCAT44(uStack_10c4,fStack_10c8);
      v->m_floats[0] = local_1138;
      v->m_floats[1] = fStack_1134;
      v->m_floats[2] = local_1148;
      v->m_floats[3] = local_115c;
    }
  }
  else {
    local_10bc = '\0';
  }
  return (bool)local_10bc;
}

Assistant:

bool btMinkowskiPenetrationDepthSolver::calcPenDepth(btSimplexSolverInterface& simplexSolver,
												   const btConvexShape* convexA,const btConvexShape* convexB,
												   const btTransform& transA,const btTransform& transB,
												   btVector3& v, btVector3& pa, btVector3& pb,
												   class btIDebugDraw* debugDraw
												   )
{

	(void)v;
	
	bool check2d= convexA->isConvex2d() && convexB->isConvex2d();

	struct btIntermediateResult : public btDiscreteCollisionDetectorInterface::Result
	{

		btIntermediateResult():m_hasResult(false)
		{
		}
		
		btVector3 m_normalOnBInWorld;
		btVector3 m_pointInWorld;
		btScalar m_depth;
		bool	m_hasResult;

		virtual void setShapeIdentifiersA(int partId0,int index0)
		{
			(void)partId0;
			(void)index0;
		}
		virtual void setShapeIdentifiersB(int partId1,int index1)
		{
			(void)partId1;
			(void)index1;
		}
		void addContactPoint(const btVector3& normalOnBInWorld,const btVector3& pointInWorld,btScalar depth)
		{
			m_normalOnBInWorld = normalOnBInWorld;
			m_pointInWorld = pointInWorld;
			m_depth = depth;
			m_hasResult = true;
		}
	};

	//just take fixed number of orientation, and sample the penetration depth in that direction
	btScalar minProj = btScalar(BT_LARGE_FLOAT);
	btVector3 minNorm(btScalar(0.), btScalar(0.), btScalar(0.));
	btVector3 minA,minB;
	btVector3 seperatingAxisInA,seperatingAxisInB;
	btVector3 pInA,qInB,pWorld,qWorld,w;

#ifndef __SPU__
#define USE_BATCHED_SUPPORT 1
#endif
#ifdef USE_BATCHED_SUPPORT

	btVector3	supportVerticesABatch[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	btVector3	supportVerticesBBatch[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	btVector3	seperatingAxisInABatch[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	btVector3	seperatingAxisInBBatch[NUM_UNITSPHERE_POINTS+MAX_PREFERRED_PENETRATION_DIRECTIONS*2];
	int i;

	int numSampleDirections = NUM_UNITSPHERE_POINTS;

	for (i=0;i<numSampleDirections;i++)
	{
		btVector3 norm = getPenetrationDirections()[i];
		seperatingAxisInABatch[i] =  (-norm) * transA.getBasis() ;
		seperatingAxisInBBatch[i] =  norm   * transB.getBasis() ;
	}

	{
		int numPDA = convexA->getNumPreferredPenetrationDirections();
		if (numPDA)
		{
			for (int i=0;i<numPDA;i++)
			{
				btVector3 norm;
				convexA->getPreferredPenetrationDirection(i,norm);
				norm  = transA.getBasis() * norm;
				getPenetrationDirections()[numSampleDirections] = norm;
				seperatingAxisInABatch[numSampleDirections] = (-norm) * transA.getBasis();
				seperatingAxisInBBatch[numSampleDirections] = norm * transB.getBasis();
				numSampleDirections++;
			}
		}
	}

	{
		int numPDB = convexB->getNumPreferredPenetrationDirections();
		if (numPDB)
		{
			for (int i=0;i<numPDB;i++)
			{
				btVector3 norm;
				convexB->getPreferredPenetrationDirection(i,norm);
				norm  = transB.getBasis() * norm;
				getPenetrationDirections()[numSampleDirections] = norm;
				seperatingAxisInABatch[numSampleDirections] = (-norm) * transA.getBasis();
				seperatingAxisInBBatch[numSampleDirections] = norm * transB.getBasis();
				numSampleDirections++;
			}
		}
	}




	convexA->batchedUnitVectorGetSupportingVertexWithoutMargin(seperatingAxisInABatch,supportVerticesABatch,numSampleDirections);
	convexB->batchedUnitVectorGetSupportingVertexWithoutMargin(seperatingAxisInBBatch,supportVerticesBBatch,numSampleDirections);

	for (i=0;i<numSampleDirections;i++)
	{
		btVector3 norm = getPenetrationDirections()[i];
		if (check2d)
		{
			norm[2] = 0.f;
		}
		if (norm.length2()>0.01)
		{

			seperatingAxisInA = seperatingAxisInABatch[i];
			seperatingAxisInB = seperatingAxisInBBatch[i];

			pInA = supportVerticesABatch[i];
			qInB = supportVerticesBBatch[i];

			pWorld = transA(pInA);	
			qWorld = transB(qInB);
			if (check2d)
			{
				pWorld[2] = 0.f;
				qWorld[2] = 0.f;
			}

			w	= qWorld - pWorld;
			btScalar delta = norm.dot(w);
			//find smallest delta
			if (delta < minProj)
			{
				minProj = delta;
				minNorm = norm;
				minA = pWorld;
				minB = qWorld;
			}
		}
	}	
#else

	int numSampleDirections = NUM_UNITSPHERE_POINTS;

#ifndef __SPU__
	{
		int numPDA = convexA->getNumPreferredPenetrationDirections();
		if (numPDA)
		{
			for (int i=0;i<numPDA;i++)
			{
				btVector3 norm;
				convexA->getPreferredPenetrationDirection(i,norm);
				norm  = transA.getBasis() * norm;
				getPenetrationDirections()[numSampleDirections] = norm;
				numSampleDirections++;
			}
		}
	}

	{
		int numPDB = convexB->getNumPreferredPenetrationDirections();
		if (numPDB)
		{
			for (int i=0;i<numPDB;i++)
			{
				btVector3 norm;
				convexB->getPreferredPenetrationDirection(i,norm);
				norm  = transB.getBasis() * norm;
				getPenetrationDirections()[numSampleDirections] = norm;
				numSampleDirections++;
			}
		}
	}
#endif // __SPU__

	for (int i=0;i<numSampleDirections;i++)
	{
		const btVector3& norm = getPenetrationDirections()[i];
		seperatingAxisInA = (-norm)* transA.getBasis();
		seperatingAxisInB = norm* transB.getBasis();
		pInA = convexA->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInA);
		qInB = convexB->localGetSupportVertexWithoutMarginNonVirtual(seperatingAxisInB);
		pWorld = transA(pInA);	
		qWorld = transB(qInB);
		w	= qWorld - pWorld;
		btScalar delta = norm.dot(w);
		//find smallest delta
		if (delta < minProj)
		{
			minProj = delta;
			minNorm = norm;
			minA = pWorld;
			minB = qWorld;
		}
	}
#endif //USE_BATCHED_SUPPORT

	//add the margins

	minA += minNorm*convexA->getMarginNonVirtual();
	minB -= minNorm*convexB->getMarginNonVirtual();
	//no penetration
	if (minProj < btScalar(0.))
		return false;

	btScalar extraSeparation = 0.5f;///scale dependent
	minProj += extraSeparation+(convexA->getMarginNonVirtual() + convexB->getMarginNonVirtual());





//#define DEBUG_DRAW 1
#ifdef DEBUG_DRAW
	if (debugDraw)
	{
		btVector3 color(0,1,0);
		debugDraw->drawLine(minA,minB,color);
		color = btVector3 (1,1,1);
		btVector3 vec = minB-minA;
		btScalar prj2 = minNorm.dot(vec);
		debugDraw->drawLine(minA,minA+(minNorm*minProj),color);

	}
#endif //DEBUG_DRAW

	

	btGjkPairDetector gjkdet(convexA,convexB,&simplexSolver,0);

	btScalar offsetDist = minProj;
	btVector3 offset = minNorm * offsetDist;
	


	btGjkPairDetector::ClosestPointInput input;
		
	btVector3 newOrg = transA.getOrigin() + offset;

	btTransform displacedTrans = transA;
	displacedTrans.setOrigin(newOrg);

	input.m_transformA = displacedTrans;
	input.m_transformB = transB;
	input.m_maximumDistanceSquared = btScalar(BT_LARGE_FLOAT);//minProj;
	
	btIntermediateResult res;
	gjkdet.setCachedSeperatingAxis(-minNorm);
	gjkdet.getClosestPoints(input,res,debugDraw);

	btScalar correctedMinNorm = minProj - res.m_depth;


	//the penetration depth is over-estimated, relax it
	btScalar penetration_relaxation= btScalar(1.);
	minNorm*=penetration_relaxation;
	

	if (res.m_hasResult)
	{

		pa = res.m_pointInWorld - minNorm * correctedMinNorm;
		pb = res.m_pointInWorld;
		v = minNorm;
		
#ifdef DEBUG_DRAW
		if (debugDraw)
		{
			btVector3 color(1,0,0);
			debugDraw->drawLine(pa,pb,color);
		}
#endif//DEBUG_DRAW


	}
	return res.m_hasResult;
}